

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Show.cpp
# Opt level: O0

void rc::detail::showValue(string *value,ostream *os)

{
  byte __c;
  bool bVar1;
  fmtflags __fmtfl;
  _Setprecision _Var2;
  locale *__loc;
  byte *pbVar3;
  ostream *poVar4;
  void *this;
  fmtflags flags;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  locale *locale;
  ostream *os_local;
  string *value_local;
  
  __loc = (locale *)std::locale::classic();
  std::operator<<(os,'\"');
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _flags = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&flags), bVar1) {
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end2);
    __c = *pbVar3;
    bVar1 = std::isspace<char>(__c,__loc);
    if ((bVar1) || (bVar1 = std::isprint<char>(__c,__loc), !bVar1)) {
      switch(__c) {
      case 0:
        std::operator<<(os,"\\0");
        break;
      default:
        __fmtfl = std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)));
        std::operator<<(os,"\\x");
        poVar4 = (ostream *)std::ostream::operator<<(os,std::hex);
        _Var2 = std::setprecision(2);
        poVar4 = std::operator<<(poVar4,_Var2);
        this = (void *)std::ostream::operator<<(poVar4,std::uppercase);
        std::ostream::operator<<(this,(uint)__c);
        std::ios_base::flags((ios_base *)(os + *(long *)(*(long *)os + -0x18)),__fmtfl);
        break;
      case 7:
        std::operator<<(os,"\\a");
        break;
      case 8:
        std::operator<<(os,"\\b");
        break;
      case 9:
        std::operator<<(os,"\\t");
        break;
      case 10:
        std::operator<<(os,"\\n");
        break;
      case 0xb:
        std::operator<<(os,"\\v");
        break;
      case 0xc:
        std::operator<<(os,"\\f");
        break;
      case 0xd:
        std::operator<<(os,"\\r");
        break;
      case 0x20:
        std::operator<<(os,' ');
      }
    }
    else if (__c == 0x22) {
      std::operator<<(os,"\\\"");
    }
    else if (__c == 0x5c) {
      std::operator<<(os,"\\");
    }
    else {
      std::operator<<(os,__c);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  std::operator<<(os,'\"');
  return;
}

Assistant:

void showValue(const std::string &value, std::ostream &os) {
  const auto &locale = std::locale::classic();
  os << '"';
  for (char c : value) {
    if (!std::isspace(c, locale) && std::isprint(c, locale)) {
      switch (c) {
      case '\\':
        os << "\\";
        break;
      case '"':
        os << "\\\"";
        break;
      default:
        os << c;
      }
    } else {
      switch (c) {
      case 0x00:
        os << "\\0";
        break;
      case 0x07:
        os << "\\a";
        break;
      case 0x08:
        os << "\\b";
        break;
      case 0x0C:
        os << "\\f";
        break;
      case 0x0A:
        os << "\\n";
        break;
      case 0x0D:
        os << "\\r";
        break;
      case 0x09:
        os << "\\t";
        break;
      case 0x0B:
        os << "\\v";
        break;
      case ' ':
        os << ' ';
        break;
      default:
        auto flags = os.flags();
        os << "\\x";
        os << std::hex << std::setprecision(2) << std::uppercase
           << static_cast<int>(c & 0xFF);
        os.flags(flags);
      }
    }
  }
  os << '"';
}